

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

ssize_t Curl_bufq_sipn(bufq *q,size_t max_len,Curl_bufq_reader *reader,void *reader_ctx,
                      CURLcode *err)

{
  buf_chunk *pbVar1;
  ulong uVar2;
  ssize_t sVar3;
  ulong uVar4;
  
  *err = CURLE_AGAIN;
  pbVar1 = get_non_full_tail(q);
  if (pbVar1 == (buf_chunk *)0x0) {
    if (q->chunk_count < q->max_chunks) {
      *err = CURLE_OUT_OF_MEMORY;
      return -1;
    }
  }
  else {
    uVar2 = pbVar1->dlen - pbVar1->w_offset;
    if (uVar2 != 0) {
      uVar4 = max_len;
      if (uVar2 < max_len) {
        uVar4 = uVar2;
      }
      if (max_len == 0) {
        uVar4 = uVar2;
      }
      sVar3 = (*reader)(reader_ctx,(pbVar1->x).data + pbVar1->w_offset,uVar4,err);
      if (sVar3 < 1) {
        if (sVar3 < 0) {
          return -1;
        }
        *err = CURLE_OK;
        return 0;
      }
      pbVar1->w_offset = pbVar1->w_offset + sVar3;
      return sVar3;
    }
  }
  *err = CURLE_AGAIN;
  return -1;
}

Assistant:

ssize_t Curl_bufq_sipn(struct bufq *q, size_t max_len,
                       Curl_bufq_reader *reader, void *reader_ctx,
                       CURLcode *err)
{
  struct buf_chunk *tail = NULL;
  ssize_t nread;

  *err = CURLE_AGAIN;
  tail = get_non_full_tail(q);
  if(!tail) {
    if(q->chunk_count < q->max_chunks) {
      *err = CURLE_OUT_OF_MEMORY;
      return -1;
    }
    /* full, blocked */
    *err = CURLE_AGAIN;
    return -1;
  }

  nread = chunk_slurpn(tail, max_len, reader, reader_ctx, err);
  if(nread < 0) {
    return -1;
  }
  else if(nread == 0) {
    /* eof */
    *err = CURLE_OK;
  }
  return nread;
}